

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void reverse_sequence_iterator_kvs_test(void)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  fdb_kvs_handle *in_stack_fffffffffffff9f8;
  fdb_file_handle *in_stack_fffffffffffffa00;
  fdb_iterator *in_stack_fffffffffffffa08;
  size_t in_stack_fffffffffffffa20;
  fdb_doc *apfStack_5b8 [5];
  fdb_doc **in_stack_fffffffffffffa70;
  fdb_iterator *in_stack_fffffffffffffa78;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_iterator *local_b0;
  fdb_iterator *iterator2;
  fdb_iterator *iterator;
  size_t *psStack_98;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc2;
  fdb_doc **doc;
  fdb_kvs_handle *kv2;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  int n;
  int count;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  dbfile._0_4_ = 10;
  doc2 = apfStack_5b8;
  rdoc = (fdb_doc *)&stack0xfffffffffffff9f8;
  psStack_98 = (size_t *)0x0;
  n = system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.wal_flush_before_commit = true;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fdb_open((fdb_file_handle **)fconfig.num_keeping_headers,(char *)fconfig.max_block_reusing_cycle,
           (fdb_config *)fconfig.min_block_reuse_filesize);
  fdb_kvs_open_default
            (in_stack_fffffffffffffa00,(fdb_kvs_handle **)in_stack_fffffffffffff9f8,
             (fdb_kvs_config *)0x1164c4);
  iterator._4_4_ = fdb_set_log_callback(kv2,logCallbackFunc,"reverse_sequence_iterator_kvs_test");
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xa60);
    reverse_sequence_iterator_kvs_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xa60,"void reverse_sequence_iterator_kvs_test()");
    }
  }
  iterator._4_4_ =
       fdb_kvs_open((fdb_file_handle *)fconfig._96_8_,(fdb_kvs_handle **)fconfig.compaction_cb,
                    (char *)fconfig._80_8_,(fdb_kvs_config *)fconfig.prefetch_duration);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xa64);
    reverse_sequence_iterator_kvs_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xa64,"void reverse_sequence_iterator_kvs_test()");
    }
  }
  for (count = 0; count < (int)dbfile; count = count + 1) {
    sprintf(metabuf + 0xf8,"kEy%d",(ulong)(uint)count);
    sprintf(bodybuf + 0xf8,"mEta%d",(ulong)(uint)count);
    sprintf((char *)&fconfig.num_blocks_readahead,"bOdy%d",(ulong)(uint)count);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x116698;
    sVar2 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
                   (size_t)in_stack_fffffffffffff9f8,pvVar3,sVar2,(void *)0x1166cf,
                   in_stack_fffffffffffffa20);
    iterator._4_4_ = fdb_set((fdb_kvs_handle *)doc,(fdb_doc *)(&rdoc->keylen)[count]);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xa6e);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xa6e,"void reverse_sequence_iterator_kvs_test()");
      }
    }
  }
  for (count = 0; count < (int)dbfile; count = count + 2) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)count);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)count);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)count);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x116831;
    sVar2 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
                   (size_t)in_stack_fffffffffffff9f8,pvVar3,sVar2,(void *)0x116868,
                   in_stack_fffffffffffffa20);
    fdb_set(kv2,doc2[count]);
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff9f8,'\0');
  for (count = 1; count < (int)dbfile; count = count + 2) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)count);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)count);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)count);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x11696a;
    sVar2 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
                   (size_t)in_stack_fffffffffffff9f8,pvVar3,sVar2,(void *)0x1169a1,
                   in_stack_fffffffffffffa20);
    fdb_set(kv2,doc2[count]);
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff9f8,'\0');
  iterator._4_4_ = fdb_iterator_sequence_init(kv2,&iterator2,0,0,0);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xa8c);
    reverse_sequence_iterator_kvs_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xa8c,"void reverse_sequence_iterator_kvs_test()");
    }
  }
  count = 0;
  dbfile._4_4_ = 0;
  do {
    fdb_iterator_get(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    iVar1 = memcmp((void *)psStack_98[4],doc2[count]->key,*psStack_98);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xa92);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      iVar1 = memcmp((void *)psStack_98[4],doc2[count]->key,*psStack_98);
      if (iVar1 != 0) {
        __assert_fail("!memcmp(rdoc->key, doc[i]->key, rdoc->keylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xa92,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_98[7],doc2[count]->meta,psStack_98[1]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xa93);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      iVar1 = memcmp((void *)psStack_98[7],doc2[count]->meta,psStack_98[1]);
      if (iVar1 != 0) {
        __assert_fail("!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xa93,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_98[8],doc2[count]->body,psStack_98[2]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xa94);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      iVar1 = memcmp((void *)psStack_98[8],doc2[count]->body,psStack_98[2]);
      if (iVar1 != 0) {
        __assert_fail("!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xa94,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x116cbb);
    psStack_98 = (size_t *)0x0;
    dbfile._4_4_ = dbfile._4_4_ + 1;
    if ((int)dbfile <= count + 2) break;
    count = count + 2;
    iterator._4_4_ = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffff9f8);
  } while (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL);
  if (dbfile._4_4_ != (int)dbfile / 2) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xa9f);
    reverse_sequence_iterator_kvs_test::__test_pass = 0;
    if (dbfile._4_4_ != (int)dbfile / 2) {
      __assert_fail("count==n/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xa9f,"void reverse_sequence_iterator_kvs_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_sequence_init((fdb_kvs_handle *)doc,&local_b0,0,0,0);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xaa3);
    reverse_sequence_iterator_kvs_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xaa3,"void reverse_sequence_iterator_kvs_test()");
    }
  }
  do {
    iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xaa6);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xaa6,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x116ea5);
    psStack_98 = (size_t *)0x0;
    iterator._4_4_ = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffff9f8);
  } while (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL);
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff9f8,'\0');
  count = (int)dbfile + -4;
  dbfile._4_4_ = 0;
  while( true ) {
    iterator._4_4_ = fdb_iterator_prev((fdb_iterator *)in_stack_fffffffffffff9f8);
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) break;
    iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xabc);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xabc,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_98[4],doc2[count]->key,*psStack_98);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xabd);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      iVar1 = memcmp((void *)psStack_98[4],doc2[count]->key,*psStack_98);
      if (iVar1 != 0) {
        __assert_fail("!memcmp(rdoc->key, doc[i]->key, rdoc->keylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xabd,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_98[7],doc2[count]->meta,psStack_98[1]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xabe);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      iVar1 = memcmp((void *)psStack_98[7],doc2[count]->meta,psStack_98[1]);
      if (iVar1 != 0) {
        __assert_fail("!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xabe,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_98[8],doc2[count]->body,psStack_98[2]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xabf);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      iVar1 = memcmp((void *)psStack_98[8],doc2[count]->body,psStack_98[2]);
      if (iVar1 != 0) {
        __assert_fail("!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xabf,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x1171d0);
    psStack_98 = (size_t *)0x0;
    count = count + -2;
    dbfile._4_4_ = dbfile._4_4_ + 1;
  }
  if (dbfile._4_4_ != 4) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xac6);
    reverse_sequence_iterator_kvs_test::__test_pass = 0;
    if (dbfile._4_4_ != 4) {
      __assert_fail("count==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xac6,"void reverse_sequence_iterator_kvs_test()");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffffa08);
  count = (int)dbfile + -1;
  dbfile._4_4_ = 0;
  while( true ) {
    iterator._4_4_ = fdb_iterator_prev((fdb_iterator *)in_stack_fffffffffffff9f8);
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) break;
    iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xad2);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xad2,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_98[4],*(void **)((&rdoc->keylen)[count] + 0x20),*psStack_98);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xad3);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      iVar1 = memcmp((void *)psStack_98[4],*(void **)((&rdoc->keylen)[count] + 0x20),*psStack_98);
      if (iVar1 != 0) {
        __assert_fail("!memcmp(rdoc->key, doc2[i]->key, rdoc->keylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xad3,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_98[7],*(void **)((&rdoc->keylen)[count] + 0x38),psStack_98[1]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xad4);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      iVar1 = memcmp((void *)psStack_98[7],*(void **)((&rdoc->keylen)[count] + 0x38),psStack_98[1]);
      if (iVar1 != 0) {
        __assert_fail("!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xad4,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_98[8],*(void **)((&rdoc->keylen)[count] + 0x40),psStack_98[2]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xad5);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      iVar1 = memcmp((void *)psStack_98[8],*(void **)((&rdoc->keylen)[count] + 0x40),psStack_98[2]);
      if (iVar1 != 0) {
        __assert_fail("!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xad5,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x11755d);
    psStack_98 = (size_t *)0x0;
    count = count + -1;
    dbfile._4_4_ = dbfile._4_4_ + 1;
  }
  if (dbfile._4_4_ != (int)dbfile) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xadb);
    reverse_sequence_iterator_kvs_test::__test_pass = 0;
    if (dbfile._4_4_ != (int)dbfile) {
      __assert_fail("count==n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xadb,"void reverse_sequence_iterator_kvs_test()");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffffa08);
  count = 0;
  dbfile._4_4_ = 0;
  iterator._4_4_ = fdb_iterator_sequence_init(kv2,&iterator2,0,0,0);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xae2);
    reverse_sequence_iterator_kvs_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xae2,"void reverse_sequence_iterator_kvs_test()");
    }
  }
  while( true ) {
    iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xae5);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xae5,"void reverse_sequence_iterator_kvs_test()");
      }
    }
    iVar1 = memcmp((void *)psStack_98[4],doc2[count]->key,*psStack_98);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",doc2[count]->key,psStack_98[4],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xae6);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xae6,"void reverse_sequence_iterator_kvs_test()");
    }
    iVar1 = memcmp((void *)psStack_98[7],doc2[count]->meta,psStack_98[1]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",doc2[count]->meta,psStack_98[7],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xae7);
      reverse_sequence_iterator_kvs_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xae7,"void reverse_sequence_iterator_kvs_test()");
    }
    iVar1 = memcmp((void *)psStack_98[8],doc2[count]->body,psStack_98[2]);
    if (iVar1 != 0) break;
    fdb_doc_free((fdb_doc *)0x1178d1);
    psStack_98 = (size_t *)0x0;
    if (count == 8) {
      count = 1;
    }
    else {
      count = count + 2;
    }
    dbfile._4_4_ = dbfile._4_4_ + 1;
    iterator._4_4_ = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffff9f8);
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
      if (dbfile._4_4_ != (int)dbfile) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xaf6);
        reverse_sequence_iterator_kvs_test::__test_pass = 0;
        if (dbfile._4_4_ != (int)dbfile) {
          __assert_fail("count==n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0xaf6,"void reverse_sequence_iterator_kvs_test()");
        }
      }
      fdb_iterator_close(in_stack_fffffffffffffa08);
      for (count = 0; count < (int)dbfile; count = count + 1) {
        fdb_doc_free((fdb_doc *)0x1179ac);
        fdb_doc_free((fdb_doc *)0x1179c0);
      }
      fdb_kvs_close(in_stack_fffffffffffff9f8);
      fdb_kvs_close(in_stack_fffffffffffff9f8);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffff9f8);
      fdb_shutdown();
      memleak_end();
      if (reverse_sequence_iterator_kvs_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","reverse sequence iterator kvs test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","reverse sequence iterator kvs test");
      }
      return;
    }
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",doc2[count]->body,psStack_98[8],
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0xae8);
  reverse_sequence_iterator_kvs_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xae8,"void reverse_sequence_iterator_kvs_test()");
}

Assistant:

void reverse_sequence_iterator_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, r, count;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc **doc2 = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_iterator *iterator2;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &kv1, &kvs_config);
    status = fdb_set_log_callback(kv1, logCallbackFunc,
                                  (void *) "reverse_sequence_iterator_kvs_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store...
    status = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // to 'kv2' with entire range
    for (i=0;i<n;++i) {
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc2[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv2, doc2[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // insert kv1 documents of even number
    for (i=0;i<n;i+=2) {
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv1, doc[i]);
    }

    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert kv1 documents of odd number
    for (i=1;i<n;i+=2) {
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv1, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // iterate even docs on kv1
    status = fdb_iterator_sequence_init(kv1, &iterator, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=0;
    count = 0;
    while (1) {
        fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
        if (i + 2 >= n) {
            break;
        }
        i = i + 2; // by-seq, first come even docs, then odd
        status = fdb_iterator_next(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) break;
    }
    TEST_CHK(count==n/2);

    // iterate all docs over kv2
    status = fdb_iterator_sequence_init(kv2, &iterator2, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    while(1) {
        status = fdb_iterator_get(iterator2, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        status = fdb_iterator_next(iterator2);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
    }

    // manually flush WAL & commit
    // iterators should be unaffected
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // reverse iterate even docs over kv1
     i = n - 4;
    count = 0;
    while (1) {
        status = fdb_iterator_prev(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i-=2;
        count++;
    }

    TEST_CHK(count==4);
    fdb_iterator_close(iterator);

    i = n-1;
    count = 0;
    // reverse iterate all docs over kv2
    while (1) {
        status = fdb_iterator_prev(iterator2);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
        status = fdb_iterator_get(iterator2, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc2[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i--;
        count++;
    }
    TEST_CHK(count==n);
    fdb_iterator_close(iterator2);

    // re-open iterator after commit should return all docs for kv1
    i = 0;
    count = 0;
    status = fdb_iterator_sequence_init(kv1, &iterator, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    while (1) {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        if (i == 8) {
            i=1; // switch to odds
        } else {
            i+=2;
        }
        count++;
        status = fdb_iterator_next(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
    }
    TEST_CHK(count==n);
    fdb_iterator_close(iterator);

    // free all documents
    for (i=0;i<n;++i) {
        fdb_doc_free(doc[i]);
        fdb_doc_free(doc2[i]);
    }

    fdb_kvs_close(kv1);
    fdb_kvs_close(kv2);
    fdb_close(dbfile);

    fdb_shutdown();
    memleak_end();
    TEST_RESULT("reverse sequence iterator kvs test");

}